

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void vera::sdf(Image *_image)

{
  float fVar1;
  int iVar2;
  uint n;
  uint n_00;
  uint uVar3;
  float *f;
  undefined4 extraout_var;
  float *pfVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  
  iVar2 = (*_image->_vptr_Image[8])();
  if (iVar2 < 2) {
    n = (*_image->_vptr_Image[6])(_image);
    uVar8 = (ulong)n;
    n_00 = (*_image->_vptr_Image[7])(_image);
    uVar9 = (ulong)n_00;
    uVar3 = n_00;
    if ((int)n_00 < (int)n) {
      uVar3 = n;
    }
    uVar6 = 0xffffffffffffffff;
    if (-1 < (int)uVar3) {
      uVar6 = (ulong)uVar3 * 4;
    }
    f = (float *)operator_new__(uVar6);
    __x = extraout_XMM0_Qa;
    if (0 < (int)n) {
      uVar6 = 0;
      do {
        if ((int)n_00 < 1) {
          pfVar4 = dt(f,n_00);
        }
        else {
          uVar10 = uVar6 & 0xffffffff;
          uVar5 = 0;
          do {
            iVar2 = (*_image->_vptr_Image[0xc])(_image,uVar10);
            f[uVar5] = *(float *)CONCAT44(extraout_var,iVar2);
            uVar5 = uVar5 + 1;
            uVar10 = (ulong)((int)uVar10 + n);
          } while (uVar9 != uVar5);
          pfVar4 = dt(f,n_00);
          if (0 < (int)n_00) {
            uVar10 = 0;
            uVar5 = uVar6;
            do {
              fVar1 = pfVar4[uVar10];
              iVar2 = (*_image->_vptr_Image[0xc])(_image,uVar5 & 0xffffffff);
              *(float *)CONCAT44(extraout_var_00,iVar2) = fVar1;
              uVar10 = uVar10 + 1;
              uVar5 = (ulong)((int)uVar5 + n);
            } while (uVar9 != uVar10);
          }
        }
        operator_delete__(pfVar4);
        uVar6 = uVar6 + 1;
        __x = extraout_XMM0_Qa_00;
      } while (uVar6 != uVar8);
    }
    if (0 < (int)n_00) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        if ((int)n < 1) {
          pfVar4 = dt(f,n);
        }
        else {
          uVar5 = 0;
          do {
            iVar2 = (*_image->_vptr_Image[0xc])(_image,(ulong)(uint)((int)uVar5 + (int)lVar7));
            f[uVar5] = *(float *)CONCAT44(extraout_var_01,iVar2);
            uVar5 = uVar5 + 1;
          } while (uVar8 != uVar5);
          pfVar4 = dt(f,n);
          if (0 < (int)n) {
            uVar5 = 0;
            do {
              fVar1 = pfVar4[uVar5];
              iVar2 = (*_image->_vptr_Image[0xc])(_image,(ulong)(uint)((int)uVar5 + (int)lVar7));
              *(float *)CONCAT44(extraout_var_02,iVar2) = fVar1;
              uVar5 = uVar5 + 1;
            } while (uVar8 != uVar5);
          }
        }
        operator_delete__(pfVar4);
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + uVar8;
        __x = extraout_XMM0_Qa_01;
      } while (uVar6 != uVar9);
    }
    sqrt(__x);
    autolevel(_image);
    operator_delete__(f);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"We need a one channel image to compute an SDF",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  return;
}

Assistant:

void sdf(Image& _image) {
    if (_image.getChannels() > 1) {
        std::cout << "We need a one channel image to compute an SDF" << std::endl;
        return;
    }

    int width = _image.getWidth();
    int height = _image.getHeight();
    float *f = new float[std::max(width, height)];

    // transform along columns
    for (int x = 0; x < width; x++) {
        for (int y = 0; y < height; y++)
            f[y] = _image[y * width + x];
        
        float *d = dt(f, height);
        for (int y = 0; y < height; y++) 
            _image[y * width + x] = d[y];

        delete [] d;
    }

    // transform along rows
    for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++)
            f[x] = _image[y * width + x];
        
        float *d = dt(f, width);
        for (int x = 0; x < width; x++)
            _image[y * width + x] = d[x];
            
        delete [] d;
    }

    sqrt(_image);
    autolevel(_image);

    delete [] f;
}